

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

N_Vector N_VCloneEmpty_Serial(N_Vector w)

{
  N_Vector p_Var1;
  undefined8 *puVar2;
  
  p_Var1 = (N_Vector)N_VNewEmpty(w->sunctx);
  N_VCopyOps(w,p_Var1);
  puVar2 = (undefined8 *)malloc(0x18);
  p_Var1->content = puVar2;
  *puVar2 = *w->content;
  *(undefined4 *)(puVar2 + 1) = 0;
  puVar2[2] = 0;
  return p_Var1;
}

Assistant:

N_Vector N_VCloneEmpty_Serial(N_Vector w)
{
  SUNFunctionBegin(w->sunctx);
  N_Vector v;
  N_VectorContent_Serial content;

  /* Create vector */
  v = NULL;
  v = N_VNewEmpty(w->sunctx);
  SUNCheckLastErrNull();

  /* Attach operations */
  SUNCheckCallNull(N_VCopyOps(w, v));

  /* Create content */
  content = NULL;
  content = (N_VectorContent_Serial)malloc(sizeof *content);
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);

  /* Attach content */
  v->content = content;

  /* Initialize content */
  content->length   = NV_LENGTH_S(w);
  content->own_data = SUNFALSE;
  content->data     = NULL;

  return (v);
}